

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall AppParametersTest_arg_stop_Test::TestBody(AppParametersTest_arg_stop_Test *this)

{
  bool bVar1;
  int iVar2;
  wchar_t **ppwVar3;
  wchar_t **ppwVar4;
  char *pcVar5;
  AssertHelper local_328 [8];
  Message local_320 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_318;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_308;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2f8;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_3;
  Message local_2d0 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2c8;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2b8;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2a8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_2;
  Message local_280 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_278;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_268;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_258;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_1;
  Message local_230 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_228;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_218;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_208;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  app_parameters local_1b0 [8];
  app_parameters parameters;
  undefined1 local_50 [8];
  ArgWrapper<wchar_t> envs;
  ArgWrapper<wchar_t> args;
  AppParametersTest_arg_stop_Test *this_local;
  
  ArgWrapper<wchar_t>::
  ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
            ((ArgWrapper<wchar_t> *)&envs.m_argv,L"/path/to/exe",L"--switch",L"-key",L"value",L"--",
             L"-other_key",L"value");
  ArgWrapper<wchar_t>::ArgWrapper<wchar_t_const*,wchar_t_const*>
            ((ArgWrapper<wchar_t> *)local_50,L"key=other_value",L"other_key=some_value");
  iVar2 = ArgWrapper<wchar_t>::argc((ArgWrapper<wchar_t> *)&envs.m_argv);
  ppwVar3 = ArgWrapper<wchar_t>::argv((ArgWrapper<wchar_t> *)&envs.m_argv);
  ppwVar4 = ArgWrapper<wchar_t>::argv((ArgWrapper<wchar_t> *)local_50);
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (local_1b0,iVar2,ppwVar3,ppwVar4,(unordered_set *)&gtest_ar.message_);
  std::
  unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
  ::~unordered_set((unordered_set<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>
                    *)&gtest_ar.message_);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_218,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_228);
  local_208 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_arg_value
                        (local_1b0,local_218._M_len,local_218._M_str,local_228._M_len,
                         local_228._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[6],_nullptr>
            ((EqHelper *)local_1f8,"parameters.get_arg_value(u8\"key\")","u8\"value\"",&local_208,
             (char8_t (*) [6])0x69297e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x155,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_268,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_278);
  local_258 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_env_value
                        (local_1b0,local_268._M_len,local_268._M_str,local_278._M_len,
                         local_278._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[12],_nullptr>
            ((EqHelper *)local_248,"parameters.get_env_value(u8\"key\")","u8\"other_value\"",
             &local_258,(char8_t (*) [12])"other_value");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(local_280);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x156,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_2b8,"key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_2c8);
  local_2a8 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_value
                        (local_1b0,local_2b8._M_len,local_2b8._M_str,local_2c8._M_len,
                         local_2c8._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[6],_nullptr>
            ((EqHelper *)local_298,"parameters.get_value(u8\"key\")","u8\"value\"",&local_2a8,
             (char8_t (*) [6])0x69297e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x157,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
            (&local_308,"other_key");
  std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_318);
  local_2f8 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
              jessilib::app_parameters::get_value
                        (local_1b0,local_308._M_len,local_308._M_str,local_318._M_len,
                         local_318._M_str);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_char8_t[11],_nullptr>
            ((EqHelper *)local_2e8,"parameters.get_value(u8\"other_key\")","u8\"some_value\"",
             &local_2f8,(char8_t (*) [11])"some_value");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_320);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x158,pcVar5);
    testing::internal::AssertHelper::operator=(local_328,local_320);
    testing::internal::AssertHelper::~AssertHelper(local_328);
    testing::Message::~Message(local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  jessilib::app_parameters::~app_parameters(local_1b0);
  ArgWrapper<wchar_t>::~ArgWrapper((ArgWrapper<wchar_t> *)local_50);
  ArgWrapper<wchar_t>::~ArgWrapper((ArgWrapper<wchar_t> *)&envs.m_argv);
  return;
}

Assistant:

TEST(AppParametersTest, arg_stop) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"--switch", L"-key", L"value", L"--", L"-other_key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}